

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

SendInternalResult * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::sendInternal
          (SendInternalResult *__return_storage_ptr__,RpcRequest *this,bool isTailCall)

{
  size_t sVar1;
  RpcConnectionState *this_00;
  uint *puVar2;
  PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  *pPVar3;
  undefined7 in_register_00000011;
  anon_class_8_1_8991fb9c *func;
  long lVar4;
  Exception *exception;
  SetupSendResult result;
  NullableValue<kj::Exception> _exception2597;
  SetupSendResult local_390;
  RpcRequest *local_368;
  char local_360;
  Exception local_358;
  Maybe<kj::Exception> local_1c8;
  
  setupSend(&local_390,this,isTailCall);
  *(QuestionId *)(this->callBuilder)._builder.data = local_390.questionId;
  if ((int)CONCAT71(in_register_00000011,isTailCall) != 0) {
    *(undefined2 *)((long)(this->callBuilder)._builder.data + 6) = 1;
  }
  local_368 = this;
  kj::
  runCatchingExceptions<capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::sendInternal(bool)::_lambda()_1_>
            (&local_1c8,(kj *)&local_368,func);
  local_360 = local_1c8.ptr.isSet;
  if (local_1c8.ptr.isSet == true) {
    local_358.ownFile.content.ptr = local_1c8.ptr.field_1.value.ownFile.content.ptr;
    local_358.ownFile.content.size_ = local_1c8.ptr.field_1.value.ownFile.content.size_;
    local_358.ownFile.content.disposer = local_1c8.ptr.field_1.value.ownFile.content.disposer;
    local_1c8.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_1c8.ptr.field_1.value.ownFile.content.size_ = 0;
    local_358.file = local_1c8.ptr.field_1.value.file;
    local_358.line = local_1c8.ptr.field_1.value.line;
    local_358.type = local_1c8.ptr.field_1.value.type;
    local_358.description.content.ptr = local_1c8.ptr.field_1.value.description.content.ptr;
    local_358.description.content.size_ = local_1c8.ptr.field_1.value.description.content.size_;
    local_358.description.content.disposer =
         local_1c8.ptr.field_1.value.description.content.disposer;
    local_358.context.ptr.disposer = local_1c8.ptr.field_1.value.context.ptr.disposer;
    local_1c8.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_1c8.ptr.field_1.value.description.content.size_ = 0;
    local_358.context.ptr.ptr = local_1c8.ptr.field_1.value.context.ptr.ptr;
    local_358.remoteTrace.content.ptr = local_1c8.ptr.field_1.value.remoteTrace.content.ptr;
    local_1c8.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_358.remoteTrace.content.size_ = local_1c8.ptr.field_1.value.remoteTrace.content.size_;
    local_358.remoteTrace.content.disposer =
         local_1c8.ptr.field_1.value.remoteTrace.content.disposer;
    local_1c8.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_1c8.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy(local_358.trace,(void *)((long)&local_1c8.ptr.field_1 + 0x68),0x105);
    local_358.details.builder.ptr = local_1c8.ptr.field_1.value.details.builder.ptr;
    local_358.details.builder.pos = local_1c8.ptr.field_1.value.details.builder.pos;
    local_358.details.builder.endPtr = local_1c8.ptr.field_1.value.details.builder.endPtr;
    local_358.details.builder.disposer = local_1c8.ptr.field_1.value.details.builder.disposer;
    local_1c8.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_1c8.ptr.field_1.value.details.builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    local_1c8.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    kj::Exception::~Exception(&local_1c8.ptr.field_1.value);
  }
  if (local_360 == '\x01') {
    (local_390.question)->isAwaitingReturn = false;
    (local_390.question)->skipFinish = true;
    sVar1 = ((local_390.question)->paramExports).size_;
    if (sVar1 != 0) {
      this_00 = (this->connectionState).ptr;
      puVar2 = ((local_390.question)->paramExports).ptr;
      lVar4 = 0;
      do {
        releaseExport(this_00,*(ExportId *)((long)puVar2 + lVar4),1);
        lVar4 = lVar4 + 4;
      } while (sVar1 << 2 != lVar4);
    }
    pPVar3 = ((local_390.super_SendInternalResult.questionRef.ptr)->fulfiller).ptr.ptr;
    if (pPVar3 != (PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
                   *)0x0) {
      (**(pPVar3->super_PromiseRejector)._vptr_PromiseRejector)(pPVar3,&local_358);
    }
  }
  if (local_360 == '\x01') {
    kj::Exception::~Exception(&local_358);
  }
  (__return_storage_ptr__->questionRef).disposer =
       local_390.super_SendInternalResult.questionRef.disposer;
  (__return_storage_ptr__->questionRef).ptr = local_390.super_SendInternalResult.questionRef.ptr;
  (__return_storage_ptr__->promise).super_PromiseBase.node.ptr =
       (PromiseNode *)local_390.super_SendInternalResult.promise.super_PromiseBase.node.ptr;
  return __return_storage_ptr__;
}

Assistant:

SendInternalResult sendInternal(bool isTailCall) {
      auto result = setupSend(isTailCall);

      // Finish and send.
      callBuilder.setQuestionId(result.questionId);
      if (isTailCall) {
        callBuilder.getSendResultsTo().setYourself();
      }
      KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
        KJ_CONTEXT("sending RPC call",
           callBuilder.getInterfaceId(), callBuilder.getMethodId());
        message->send();
      })) {
        // We can't safely throw the exception from here since we've already modified the question
        // table state. We'll have to reject the promise instead.
        // TODO(bug): Attempts to use the pipeline will end up sending a request referencing a
        //   bogus question ID. Can we rethrow after doing the appropriate cleanup, so the pipeline
        //   is never created? See the approach in sendForPipelineInternal() below.
        result.question.isAwaitingReturn = false;
        result.question.skipFinish = true;
        connectionState->releaseExports(result.question.paramExports);
        result.questionRef->reject(kj::mv(exception));
      }

      // Send and return.
      return kj::mv(result);
    }